

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigslot.h
# Opt level: O3

void __thiscall
sigslot::
_signal_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
::slot_disconnect(_signal_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
                  *this,has_slots<sigslot::multi_threaded_local> *pslot)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  has_slots<sigslot::multi_threaded_local> *phVar4;
  
  (*(this->super__signal_base<sigslot::multi_threaded_local>).super_multi_threaded_local.
    _vptr_multi_threaded_local[2])();
  p_Var2 = (this->m_connected_slots).
           super__List_base<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var3 = p_Var2, p_Var3 != (_List_node_base *)&this->m_connected_slots) {
    p_Var2 = p_Var3->_M_next;
    phVar4 = (has_slots<sigslot::multi_threaded_local> *)
             (**(code **)((long)(p_Var3[1]._M_next)->_M_next + 0x10))();
    if (phVar4 == pslot) {
      if (p_Var3[1]._M_next != (_List_node_base *)0x0) {
        (**(code **)((long)(p_Var3[1]._M_next)->_M_next + 8))();
      }
      psVar1 = &(this->m_connected_slots).
                super__List_base<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var3,0x18);
    }
  }
  (*(this->super__signal_base<sigslot::multi_threaded_local>).super_multi_threaded_local.
    _vptr_multi_threaded_local[3])(this);
  return;
}

Assistant:

void slot_disconnect(has_slots<mt_policy>* pslot)
		{
			lock_block<mt_policy> lock(this);
			iterator it = m_connected_slots.begin();
			iterator itEnd = m_connected_slots.end();

			while(it != itEnd)
			{
				iterator itNext = it;
				++itNext;

				if((*it)->getdest() == pslot)
				{
					delete *it;
					m_connected_slots.erase(it);
				}

				it = itNext;
			}
		}